

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_4,_3> *
tcu::operator*(Matrix<float,_4,_3> *__return_storage_ptr__,Matrix<float,_4,_2> *a,
              Matrix<float,_2,_3> *b)

{
  int row;
  long lVar1;
  Vector<float,_2> *pVVar2;
  long lVar3;
  long lVar4;
  float v;
  float fVar5;
  
  Matrix<float,_4,_3>::Matrix(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    pVVar2 = (Vector<float,_2> *)b;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      fVar5 = 0.0;
      for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
        fVar5 = fVar5 + *(float *)((long)a + lVar4 * 4) *
                        *(float *)((long)((Vector<tcu::Vector<float,_2>,_3> *)pVVar2->m_data)->
                                         m_data[0].m_data + lVar4);
      }
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = fVar5;
      pVVar2 = pVVar2 + 1;
    }
    a = (Matrix<float,_4,_2> *)((long)a + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}